

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorK<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  NodeRef nodeRef;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  RTCIntersectArguments *pRVar13;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar18;
  NodeRef *pNVar19;
  bool bVar20;
  bool bVar21;
  int iVar22;
  int iVar23;
  float fVar24;
  float fVar31;
  float fVar32;
  vint4 bi;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar33;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar35;
  undefined1 auVar36 [16];
  float fVar37;
  float fVar41;
  float fVar42;
  vint4 bi_1;
  undefined1 auVar38 [16];
  float fVar43;
  undefined1 auVar39 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar40;
  float fVar44;
  float fVar45;
  float fVar46;
  vint4 ai;
  float fVar47;
  float fVar48;
  float fVar50;
  float fVar51;
  vint4 ai_1;
  undefined1 auVar49 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  vint4 ai_3;
  float fVar56;
  uint uVar59;
  uint uVar60;
  vint4 bi_2;
  undefined1 auVar57 [16];
  uint uVar61;
  undefined1 auVar58 [16];
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  vint4 bi_3;
  float fVar68;
  float fVar69;
  uint uVar70;
  uint uVar72;
  uint uVar73;
  vint4 ai_2;
  undefined1 auVar71 [16];
  uint uVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  vint4 bi_8;
  float fVar94;
  vbool<4> vVar95;
  Precalculations pre;
  undefined1 local_17a8 [16];
  vbool<4> valid0;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  uint local_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar10 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar10 != 8) {
    pRVar13 = (RTCIntersectArguments *)ray;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pRVar13 = context->args,
       (pRVar13->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar27 = *(undefined1 (*) [16])(ray + 0x80);
    uVar75 = -(uint)(0.0 <= auVar27._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar76 = -(uint)(0.0 <= auVar27._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar77 = -(uint)(0.0 <= auVar27._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar78 = -(uint)(0.0 <= auVar27._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar38._4_4_ = uVar76;
    auVar38._0_4_ = uVar75;
    auVar38._8_4_ = uVar77;
    auVar38._12_4_ = uVar78;
    iVar12 = movmskps((int)pRVar13,auVar38);
    if (iVar12 != 0) {
      auVar38 = *(undefined1 (*) [16])(ray + 0x40);
      fVar62 = (float)DAT_01ff1d40;
      fVar64 = DAT_01ff1d40._4_4_;
      fVar66 = DAT_01ff1d40._8_4_;
      fVar68 = DAT_01ff1d40._12_4_;
      auVar49._4_4_ = -(uint)(ABS(auVar38._4_4_) < fVar64);
      auVar49._0_4_ = -(uint)(ABS(auVar38._0_4_) < fVar62);
      auVar49._8_4_ = -(uint)(ABS(auVar38._8_4_) < fVar66);
      auVar49._12_4_ = -(uint)(ABS(auVar38._12_4_) < fVar68);
      auVar57 = blendvps(auVar38,_DAT_01ff1d40,auVar49);
      auVar38 = *(undefined1 (*) [16])(ray + 0x60);
      auVar71._4_4_ = -(uint)(ABS(auVar38._4_4_) < fVar64);
      auVar71._0_4_ = -(uint)(ABS(auVar38._0_4_) < fVar62);
      auVar71._8_4_ = -(uint)(ABS(auVar38._8_4_) < fVar66);
      auVar71._12_4_ = -(uint)(ABS(auVar38._12_4_) < fVar68);
      auVar49 = blendvps(auVar38,_DAT_01ff1d40,auVar71);
      auVar38 = *(undefined1 (*) [16])(ray + 0x50);
      auVar71 = maxps(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0));
      iVar12 = (int)DAT_01feb9f0;
      iVar79 = DAT_01feb9f0._4_4_;
      iVar80 = DAT_01feb9f0._8_4_;
      iVar81 = DAT_01feb9f0._12_4_;
      auVar25._4_4_ = uVar76;
      auVar25._0_4_ = uVar75;
      auVar25._8_4_ = uVar77;
      auVar25._12_4_ = uVar78;
      aVar82.v = (__m128)blendvps(_DAT_01feb9f0,auVar71,auVar25);
      auVar71 = rcpps(auVar71,auVar57);
      fVar87 = auVar71._0_4_;
      fVar88 = auVar71._4_4_;
      fVar89 = auVar71._8_4_;
      fVar90 = auVar71._12_4_;
      iVar22 = -(uint)(ABS(auVar38._8_4_) < fVar66);
      iVar23 = -(uint)(ABS(auVar38._12_4_) < fVar68);
      auVar34._0_8_ =
           CONCAT44(-(uint)(ABS(auVar38._4_4_) < fVar64),-(uint)(ABS(auVar38._0_4_) < fVar62));
      auVar34._8_4_ = iVar22;
      auVar34._12_4_ = iVar23;
      auVar26._8_4_ = iVar22;
      auVar26._0_8_ = auVar34._0_8_;
      auVar26._12_4_ = iVar23;
      auVar71 = blendvps(auVar38,_DAT_01ff1d40,auVar26);
      auVar38 = maxps(auVar27,ZEXT816(0));
      auVar27._4_4_ = uVar76;
      auVar27._0_4_ = uVar75;
      auVar27._8_4_ = uVar77;
      auVar27._12_4_ = uVar78;
      auVar38 = blendvps(_DAT_01feba00,auVar38,auVar27);
      auVar27 = rcpps(auVar27,auVar49);
      fVar62 = auVar27._0_4_;
      fVar64 = auVar27._4_4_;
      fVar66 = auVar27._8_4_;
      fVar68 = auVar27._12_4_;
      auVar27 = rcpps(auVar34,auVar71);
      fVar83 = auVar27._0_4_;
      fVar84 = auVar27._4_4_;
      fVar85 = auVar27._8_4_;
      fVar86 = auVar27._12_4_;
      uVar5 = *(undefined8 *)ray;
      uVar6 = *(undefined8 *)(ray + 8);
      fVar83 = (1.0 - auVar71._0_4_ * fVar83) * fVar83 + fVar83;
      fVar84 = (1.0 - auVar71._4_4_ * fVar84) * fVar84 + fVar84;
      fVar85 = (1.0 - auVar71._8_4_ * fVar85) * fVar85 + fVar85;
      fVar86 = (1.0 - auVar71._12_4_ * fVar86) * fVar86 + fVar86;
      uVar7 = *(undefined8 *)(ray + 0x10);
      uVar8 = *(undefined8 *)(ray + 0x18);
      fVar87 = (1.0 - auVar57._0_4_ * fVar87) * fVar87 + fVar87;
      fVar88 = (1.0 - auVar57._4_4_ * fVar88) * fVar88 + fVar88;
      fVar89 = (1.0 - auVar57._8_4_ * fVar89) * fVar89 + fVar89;
      fVar90 = (1.0 - auVar57._12_4_ * fVar90) * fVar90 + fVar90;
      auVar27 = *(undefined1 (*) [16])(ray + 0x20);
      fVar62 = (1.0 - auVar49._0_4_ * fVar62) * fVar62 + fVar62;
      fVar64 = (1.0 - auVar49._4_4_ * fVar64) * fVar64 + fVar64;
      fVar66 = (1.0 - auVar49._8_4_ * fVar66) * fVar66 + fVar66;
      fVar68 = (1.0 - auVar49._12_4_ * fVar68) * fVar68 + fVar68;
      local_17a8._0_8_ = CONCAT44(uVar76,uVar75) ^ 0xffffffffffffffff;
      local_17a8._8_4_ = uVar77 ^ 0xffffffff;
      local_17a8._12_4_ = uVar78 ^ 0xffffffff;
      pNVar19 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar18 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01feb9f0;
      stack_node[1].ptr = uVar10;
      stack_near[1].field_0 = aVar82;
LAB_00259877:
      paVar18 = paVar18 + -1;
      pNVar1 = pNVar19 + -1;
      pNVar19 = pNVar19 + -1;
      bVar21 = true;
      if (pNVar1->ptr != 0xfffffffffffffff8) {
        aVar40 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18->v;
        fVar91 = auVar38._0_4_;
        fVar92 = auVar38._4_4_;
        fVar93 = auVar38._8_4_;
        fVar94 = auVar38._12_4_;
        auVar57._4_4_ = -(uint)(aVar40.v[1] < fVar92);
        auVar57._0_4_ = -(uint)(aVar40.v[0] < fVar91);
        auVar57._8_4_ = -(uint)(aVar40.v[2] < fVar93);
        auVar57._12_4_ = -(uint)(aVar40.v[3] < fVar94);
        uVar9 = movmskps((int)uVar10,auVar57);
        uVar10 = (ulong)uVar9;
        sVar15 = pNVar1->ptr;
        if (uVar9 != 0) {
          do {
            if ((sVar15 & 8) != 0) {
              if (sVar15 == 0xfffffffffffffff8) goto LAB_00259a00;
              auVar29._4_4_ = -(uint)(aVar40.v[1] < fVar92);
              auVar29._0_4_ = -(uint)(aVar40.v[0] < fVar91);
              auVar29._8_4_ = -(uint)(aVar40.v[2] < fVar93);
              auVar29._12_4_ = -(uint)(aVar40.v[3] < fVar94);
              uVar9 = movmskps((int)uVar10,auVar29);
              uVar10 = (ulong)uVar9;
              if (uVar9 != 0) {
                valid0.field_0._0_8_ = local_17a8._0_8_ ^ 0xffffffffffffffff;
                valid0.field_0.i[2] = local_17a8._8_4_ ^ 0xffffffff;
                valid0.field_0.i[3] = local_17a8._12_4_ ^ 0xffffffff;
                uVar11 = (ulong)((uint)sVar15 & 0xf) - 8;
                uVar10 = uVar11;
                if (uVar11 == 0) goto LAB_00259abe;
                prim = (Primitive_conflict4 *)(sVar15 & 0xfffffffffffffff0);
                uVar14 = 1;
                goto LAB_00259a71;
              }
              break;
            }
            aVar35.i[1] = iVar79;
            aVar35.i[0] = iVar12;
            aVar35.i[2] = iVar80;
            aVar35.i[3] = iVar81;
            uVar10 = 0;
            sVar16 = 8;
            do {
              sVar2 = *(size_t *)((sVar15 & 0xfffffffffffffff0) + uVar10 * 8);
              sVar17 = sVar16;
              aVar40 = aVar35;
              if (sVar2 != 8) {
                fVar69 = *(float *)(sVar15 + 0x20 + uVar10 * 4);
                fVar33 = *(float *)(sVar15 + 0x30 + uVar10 * 4);
                fVar24 = *(float *)(sVar15 + 0x40 + uVar10 * 4);
                fVar43 = *(float *)(sVar15 + 0x50 + uVar10 * 4);
                local_1708 = (float)uVar5;
                fStack_1704 = (float)((ulong)uVar5 >> 0x20);
                fStack_1700 = (float)uVar6;
                fStack_16fc = (float)((ulong)uVar6 >> 0x20);
                fVar44 = (fVar69 - local_1708) * fVar87;
                fVar45 = (fVar69 - fStack_1704) * fVar88;
                fVar46 = (fVar69 - fStack_1700) * fVar89;
                fVar47 = (fVar69 - fStack_16fc) * fVar90;
                local_1718 = (float)uVar7;
                fStack_1714 = (float)((ulong)uVar7 >> 0x20);
                fStack_1710 = (float)uVar8;
                fStack_170c = (float)((ulong)uVar8 >> 0x20);
                fVar48 = (fVar24 - local_1718) * fVar83;
                fVar50 = (fVar24 - fStack_1714) * fVar84;
                fVar51 = (fVar24 - fStack_1710) * fVar85;
                fVar52 = (fVar24 - fStack_170c) * fVar86;
                fVar69 = *(float *)(sVar15 + 0x60 + uVar10 * 4);
                local_1728 = auVar27._0_4_;
                fStack_1724 = auVar27._4_4_;
                fStack_1720 = auVar27._8_4_;
                fStack_171c = auVar27._12_4_;
                fVar53 = (fVar69 - local_1728) * fVar62;
                fVar54 = (fVar69 - fStack_1724) * fVar64;
                fVar55 = (fVar69 - fStack_1720) * fVar66;
                fVar56 = (fVar69 - fStack_171c) * fVar68;
                fVar24 = (fVar33 - local_1708) * fVar87;
                fVar31 = (fVar33 - fStack_1704) * fVar88;
                fVar32 = (fVar33 - fStack_1700) * fVar89;
                fVar33 = (fVar33 - fStack_16fc) * fVar90;
                fVar37 = (fVar43 - local_1718) * fVar83;
                fVar41 = (fVar43 - fStack_1714) * fVar84;
                fVar42 = (fVar43 - fStack_1710) * fVar85;
                fVar43 = (fVar43 - fStack_170c) * fVar86;
                fVar69 = *(float *)(sVar15 + 0x70 + uVar10 * 4);
                fVar63 = (fVar69 - local_1728) * fVar62;
                fVar65 = (fVar69 - fStack_1724) * fVar64;
                fVar67 = (fVar69 - fStack_1720) * fVar66;
                fVar69 = (fVar69 - fStack_171c) * fVar68;
                uVar9 = (uint)((int)fVar24 < (int)fVar44) * (int)fVar24 |
                        (uint)((int)fVar24 >= (int)fVar44) * (int)fVar44;
                uVar59 = (uint)((int)fVar31 < (int)fVar45) * (int)fVar31 |
                         (uint)((int)fVar31 >= (int)fVar45) * (int)fVar45;
                uVar60 = (uint)((int)fVar32 < (int)fVar46) * (int)fVar32 |
                         (uint)((int)fVar32 >= (int)fVar46) * (int)fVar46;
                uVar61 = (uint)((int)fVar33 < (int)fVar47) * (int)fVar33 |
                         (uint)((int)fVar33 >= (int)fVar47) * (int)fVar47;
                uVar70 = (uint)((int)fVar37 < (int)fVar48) * (int)fVar37 |
                         (uint)((int)fVar37 >= (int)fVar48) * (int)fVar48;
                uVar72 = (uint)((int)fVar41 < (int)fVar50) * (int)fVar41 |
                         (uint)((int)fVar41 >= (int)fVar50) * (int)fVar50;
                uVar73 = (uint)((int)fVar42 < (int)fVar51) * (int)fVar42 |
                         (uint)((int)fVar42 >= (int)fVar51) * (int)fVar51;
                uVar74 = (uint)((int)fVar43 < (int)fVar52) * (int)fVar43 |
                         (uint)((int)fVar43 >= (int)fVar52) * (int)fVar52;
                uVar70 = ((int)uVar70 < (int)uVar9) * uVar9 | ((int)uVar70 >= (int)uVar9) * uVar70;
                uVar72 = ((int)uVar72 < (int)uVar59) * uVar59 |
                         ((int)uVar72 >= (int)uVar59) * uVar72;
                uVar73 = ((int)uVar73 < (int)uVar60) * uVar60 |
                         ((int)uVar73 >= (int)uVar60) * uVar73;
                uVar74 = ((int)uVar74 < (int)uVar61) * uVar61 |
                         ((int)uVar74 >= (int)uVar61) * uVar74;
                uVar9 = (uint)((int)fVar63 < (int)fVar53) * (int)fVar63 |
                        (uint)((int)fVar63 >= (int)fVar53) * (int)fVar53;
                uVar59 = (uint)((int)fVar65 < (int)fVar54) * (int)fVar65 |
                         (uint)((int)fVar65 >= (int)fVar54) * (int)fVar54;
                uVar60 = (uint)((int)fVar67 < (int)fVar55) * (int)fVar67 |
                         (uint)((int)fVar67 >= (int)fVar55) * (int)fVar55;
                uVar61 = (uint)((int)fVar69 < (int)fVar56) * (int)fVar69 |
                         (uint)((int)fVar69 >= (int)fVar56) * (int)fVar56;
                auVar58._0_4_ =
                     ((int)uVar9 < (int)uVar70) * uVar70 | ((int)uVar9 >= (int)uVar70) * uVar9;
                auVar58._4_4_ =
                     ((int)uVar59 < (int)uVar72) * uVar72 | ((int)uVar59 >= (int)uVar72) * uVar59;
                auVar58._8_4_ =
                     ((int)uVar60 < (int)uVar73) * uVar73 | ((int)uVar60 >= (int)uVar73) * uVar60;
                auVar58._12_4_ =
                     ((int)uVar61 < (int)uVar74) * uVar74 | ((int)uVar61 >= (int)uVar74) * uVar61;
                uVar9 = (uint)((int)fVar24 < (int)fVar44) * (int)fVar44 |
                        (uint)((int)fVar24 >= (int)fVar44) * (int)fVar24;
                uVar59 = (uint)((int)fVar31 < (int)fVar45) * (int)fVar45 |
                         (uint)((int)fVar31 >= (int)fVar45) * (int)fVar31;
                uVar60 = (uint)((int)fVar32 < (int)fVar46) * (int)fVar46 |
                         (uint)((int)fVar32 >= (int)fVar46) * (int)fVar32;
                uVar61 = (uint)((int)fVar33 < (int)fVar47) * (int)fVar47 |
                         (uint)((int)fVar33 >= (int)fVar47) * (int)fVar33;
                uVar70 = (uint)((int)fVar37 < (int)fVar48) * (int)fVar48 |
                         (uint)((int)fVar37 >= (int)fVar48) * (int)fVar37;
                uVar72 = (uint)((int)fVar41 < (int)fVar50) * (int)fVar50 |
                         (uint)((int)fVar41 >= (int)fVar50) * (int)fVar41;
                uVar73 = (uint)((int)fVar42 < (int)fVar51) * (int)fVar51 |
                         (uint)((int)fVar42 >= (int)fVar51) * (int)fVar42;
                uVar74 = (uint)((int)fVar43 < (int)fVar52) * (int)fVar52 |
                         (uint)((int)fVar43 >= (int)fVar52) * (int)fVar43;
                uVar9 = ((int)uVar9 < (int)uVar70) * uVar9 | ((int)uVar9 >= (int)uVar70) * uVar70;
                uVar59 = ((int)uVar59 < (int)uVar72) * uVar59 |
                         ((int)uVar59 >= (int)uVar72) * uVar72;
                uVar60 = ((int)uVar60 < (int)uVar73) * uVar60 |
                         ((int)uVar60 >= (int)uVar73) * uVar73;
                uVar61 = ((int)uVar61 < (int)uVar74) * uVar61 |
                         ((int)uVar61 >= (int)uVar74) * uVar74;
                uVar70 = (uint)((int)fVar63 < (int)fVar53) * (int)fVar53 |
                         (uint)((int)fVar63 >= (int)fVar53) * (int)fVar63;
                uVar72 = (uint)((int)fVar65 < (int)fVar54) * (int)fVar54 |
                         (uint)((int)fVar65 >= (int)fVar54) * (int)fVar65;
                uVar73 = (uint)((int)fVar67 < (int)fVar55) * (int)fVar55 |
                         (uint)((int)fVar67 >= (int)fVar55) * (int)fVar67;
                uVar74 = (uint)((int)fVar69 < (int)fVar56) * (int)fVar56 |
                         (uint)((int)fVar69 >= (int)fVar56) * (int)fVar69;
                iVar22 = aVar82.i[0];
                iVar23 = aVar82.i[1];
                iVar3 = aVar82.i[2];
                iVar4 = aVar82.i[3];
                uVar70 = (uint)((int)fVar91 < (int)uVar70) * (int)fVar91 |
                         ((int)fVar91 >= (int)uVar70) * uVar70;
                uVar72 = (uint)((int)fVar92 < (int)uVar72) * (int)fVar92 |
                         ((int)fVar92 >= (int)uVar72) * uVar72;
                uVar73 = (uint)((int)fVar93 < (int)uVar73) * (int)fVar93 |
                         ((int)fVar93 >= (int)uVar73) * uVar73;
                uVar74 = (uint)((int)fVar94 < (int)uVar74) * (int)fVar94 |
                         ((int)fVar94 >= (int)uVar74) * uVar74;
                auVar28._4_4_ =
                     -(uint)((float)((uint)((int)auVar58._4_4_ < iVar23) * iVar23 |
                                    ((int)auVar58._4_4_ >= iVar23) * auVar58._4_4_) <=
                            (float)(((int)uVar59 < (int)uVar72) * uVar59 |
                                   ((int)uVar59 >= (int)uVar72) * uVar72));
                auVar28._0_4_ =
                     -(uint)((float)((uint)((int)auVar58._0_4_ < iVar22) * iVar22 |
                                    ((int)auVar58._0_4_ >= iVar22) * auVar58._0_4_) <=
                            (float)(((int)uVar9 < (int)uVar70) * uVar9 |
                                   ((int)uVar9 >= (int)uVar70) * uVar70));
                auVar28._8_4_ =
                     -(uint)((float)((uint)((int)auVar58._8_4_ < iVar3) * iVar3 |
                                    ((int)auVar58._8_4_ >= iVar3) * auVar58._8_4_) <=
                            (float)(((int)uVar60 < (int)uVar73) * uVar60 |
                                   ((int)uVar60 >= (int)uVar73) * uVar73));
                auVar28._12_4_ =
                     -(uint)((float)((uint)((int)auVar58._12_4_ < iVar4) * iVar4 |
                                    ((int)auVar58._12_4_ >= iVar4) * auVar58._12_4_) <=
                            (float)(((int)uVar61 < (int)uVar74) * uVar61 |
                                   ((int)uVar61 >= (int)uVar74) * uVar74));
                uVar9 = movmskps((int)valid_i,auVar28);
                valid_i = (vint<4> *)(ulong)uVar9;
                if ((uVar9 != 0) &&
                   (auVar39._4_4_ = iVar79, auVar39._0_4_ = iVar12, auVar39._8_4_ = iVar80,
                   auVar39._12_4_ = iVar81,
                   aVar40 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                            blendvps(auVar39,auVar58,auVar28), sVar17 = sVar2, sVar16 != 8)) {
                  pNVar19->ptr = sVar16;
                  pNVar19 = pNVar19 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18->v = aVar35;
                  paVar18 = paVar18 + 1;
                }
              }
            } while ((sVar2 != 8) &&
                    (bVar20 = uVar10 < 3, uVar10 = uVar10 + 1, sVar16 = sVar17, aVar35 = aVar40,
                    bVar20));
            uVar10 = sVar15;
            sVar15 = sVar17;
          } while (sVar17 != 8);
        }
        bVar21 = false;
      }
      goto LAB_00259a00;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    uVar10 = uVar14 + 1;
    bVar21 = uVar11 <= uVar14;
    uVar14 = uVar10;
    if (bVar21) break;
LAB_00259a71:
    valid_i = (vint<4> *)&local_16e8;
    vVar95 = InstanceArrayIntersectorK<4>::occluded
                       ((InstanceArrayIntersectorK<4> *)valid_i,&valid0,&pre,ray,context,prim);
    valid0.field_0.i[0] = ~local_16e8 & valid0.field_0.i[0];
    valid0.field_0.i[1] = ~uStack_16e4 & valid0.field_0.i[1];
    valid0.field_0.i[2] = ~uStack_16e0 & valid0.field_0.i[2];
    valid0.field_0.i[3] = ~uStack_16dc & valid0.field_0.i[3];
    uVar9 = movmskps(vVar95.field_0._0_4_,(undefined1  [16])valid0.field_0);
    uVar10 = (ulong)uVar9;
    if (uVar9 == 0) break;
  }
LAB_00259abe:
  auVar36._8_4_ = 0xffffffff;
  auVar36._0_8_ = 0xffffffffffffffff;
  auVar36._12_4_ = 0xffffffff;
  local_17a8 = local_17a8 | (undefined1  [16])valid0.field_0 ^ auVar36;
  uVar9 = movmskps((int)uVar10,local_17a8);
  uVar10 = (ulong)uVar9;
  if (uVar9 == 0xf) {
    iVar12 = 0x7f800000;
    iVar79 = 0x7f800000;
    iVar80 = 0x7f800000;
    iVar81 = 0x7f800000;
    bVar21 = true;
  }
  else {
    auVar38 = blendvps(auVar38,_DAT_01feba00,local_17a8);
    bVar21 = false;
    iVar12 = 0x7f800000;
    iVar79 = 0x7f800000;
    iVar80 = 0x7f800000;
    iVar81 = 0x7f800000;
  }
LAB_00259a00:
  if (bVar21) {
    auVar30._4_4_ = uVar76 & local_17a8._4_4_;
    auVar30._0_4_ = uVar75 & local_17a8._0_4_;
    auVar30._8_4_ = uVar77 & local_17a8._8_4_;
    auVar30._12_4_ = uVar78 & local_17a8._12_4_;
    auVar27 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar30);
    *(undefined1 (*) [16])(ray + 0x80) = auVar27;
    return;
  }
  goto LAB_00259877;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }